

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O3

void __thiscall
BaseModel::calibrateFromFiles
          (BaseModel *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list,Size *board_size,Size *square_size,int flags,string *model_filename,
          bool show_result)

{
  Size image_size;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  image_points_list;
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  object_points_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  detected_image_list;
  
  object_points_list.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  object_points_list.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  object_points_list.
  super__Vector_base<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  image_points_list.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  image_points_list.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image_points_list.
  super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  detected_image_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detected_image_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  detected_image_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  image_size.width = 0;
  image_size.height = 0;
  collectChessboardCorners
            (this,image_list,board_size,square_size,&image_size,&object_points_list,
             &image_points_list,&detected_image_list,show_result);
  (**this->_vptr_BaseModel)
            (this,&object_points_list,&image_points_list,&image_size,board_size,square_size,flags,
             &detected_image_list,model_filename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&detected_image_list);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::~vector(&image_points_list);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::~vector(&object_points_list);
  return;
}

Assistant:

void calibrateFromFiles(
    const std::vector<std::string>& image_list,
    const cv::Size& board_size,
    const cv::Size& square_size,
    const int flags,
    const std::string& model_filename,
    const bool show_result=true
  ) {
    // Gather object points, and image points regarding to Chessboard.
    std::vector<std::vector<cv::Point3f>> object_points_list;
    std::vector<std::vector<cv::Point2f>> image_points_list;
    std::vector<std::string> detected_image_list;
    cv::Size image_size;
    this->collectChessboardCorners(
      image_list,
      board_size,
      square_size,
      image_size,
      object_points_list,
      image_points_list,
      detected_image_list,
      show_result
    );

    this->calibrate(
      object_points_list,
      image_points_list,
      image_size,
      board_size,
      square_size,
      flags,
      detected_image_list,
      model_filename
    );
  }